

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_vector.c
# Opt level: O3

void vector_erase(vector v,size_t position)

{
  ulong uVar1;
  size_t sVar2;
  int iVar3;
  void *pvVar4;
  void *__dest;
  ulong uVar5;
  ulong uVar6;
  
  if ((v != (vector)0x0) && (uVar1 = v->size, position < uVar1)) {
    uVar5 = uVar1 - 1;
    if (position < uVar5) {
      sVar2 = v->type_size;
      pvVar4 = v->data;
      if (pvVar4 == (void *)0x0) {
        __dest = (void *)0x0;
        pvVar4 = (void *)0x0;
      }
      else {
        uVar5 = sVar2 * position;
        uVar6 = v->capacity * sVar2;
        __dest = (void *)((long)pvVar4 + uVar5);
        if (uVar6 < uVar5 || uVar6 - uVar5 == 0) {
          __dest = (void *)0x0;
        }
        uVar5 = (position + 1) * sVar2;
        pvVar4 = (void *)((long)pvVar4 + uVar5);
        if (uVar6 < uVar5 || uVar6 - uVar5 == 0) {
          pvVar4 = (void *)0x0;
        }
      }
      memmove(__dest,pvVar4,sVar2 * (uVar1 + ~position));
      uVar5 = v->size - 1;
    }
    v->size = uVar5;
    if ((v->capacity >> 3 < uVar5) && (iVar3 = vector_reserve(v,uVar5 * 2), iVar3 != 0)) {
      log_write_impl_va("metacall",0x1cb,"vector_erase",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_vector.c"
                        ,LOG_LEVEL_ERROR,"Vector reserve error");
      return;
    }
  }
  return;
}

Assistant:

void vector_erase(vector v, size_t position)
{
	if (v != NULL && position < v->size)
	{
		if (position < v->size - 1)
		{
			memmove(vector_data_offset_bytes(v, position * v->type_size),
				vector_data_offset_bytes(v, (position + 1) * v->type_size),
				(v->size - position - 1) * v->type_size);
		}

		--v->size;

		if (v->capacity / VECTOR_CAPACITY_MIN_USED < v->size)
		{
			if (vector_reserve(v, v->size * VECTOR_CAPACITY_INCREMENT) != 0)
			{
				log_write("metacall", LOG_LEVEL_ERROR, "Vector reserve error");
			}
		}
	}
}